

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_ObjLevelRNew(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  bool bVar2;
  int local_40;
  int local_34;
  int LevelNew;
  int Required;
  int i;
  Vec_Ptr_t *vFanouts;
  Ivy_Obj_t *pFanout;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  local_34 = 1000000;
  if ((p->fFanout != 0) && (p->vRequired != (Vec_Int_t *)0x0)) {
    vArray = Vec_PtrAlloc(10);
    LevelNew = 0;
    Ivy_ObjCollectFanouts(p,pObj,vArray);
    while( true ) {
      iVar1 = Vec_PtrSize(vArray);
      bVar2 = false;
      if (LevelNew < iVar1) {
        vFanouts = (Vec_Ptr_t *)Vec_PtrEntry(vArray,LevelNew);
        bVar2 = vFanouts != (Vec_Ptr_t *)0x0;
      }
      if (!bVar2) break;
      local_40 = Vec_IntEntry(p->vRequired,vFanouts->nCap);
      if (local_34 < local_40) {
        local_40 = local_34;
      }
      local_34 = local_40;
      LevelNew = LevelNew + 1;
    }
    Vec_PtrFree(vArray);
    return local_34 + -1;
  }
  __assert_fail("p->fFanout && p->vRequired",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                ,0x1a6,"int Ivy_ObjLevelRNew(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

int Ivy_ObjLevelRNew( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, Required, LevelNew = 1000000;
    assert( p->fFanout && p->vRequired );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        Required = Vec_IntEntry(p->vRequired, pFanout->Id);
        LevelNew = IVY_MIN( LevelNew, Required );
    }
    Vec_PtrFree( vFanouts );
    return LevelNew - 1;
}